

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.cpp
# Opt level: O2

int LiteScript::Syntax::ReadContinue
              (char *text,
              vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> *instrl,
              ErrorType *errorType)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  Instruction IStack_58;
  string keyword;
  
  keyword._M_dataplus._M_p = (pointer)&keyword.field_2;
  keyword._M_string_length = 0;
  keyword.field_2._M_local_buf[0] = '\0';
  uVar2 = ReadName(text,&keyword);
  uVar3 = 0;
  if (uVar2 != 0) {
    bVar1 = std::operator!=(&keyword,"continue");
    if (!bVar1) {
      uVar2 = ReadWhitespace(text + 8);
      Instruction::Instruction(&IStack_58,INSTR_JUMP_TO,"continue");
      std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::
      emplace_back<LiteScript::Instruction>(instrl,&IStack_58);
      uVar3 = (long)(int)uVar2 + 8;
      Instruction::~Instruction(&IStack_58);
      if (text[uVar3] == ';') {
        uVar3 = (ulong)(uVar2 + 9);
      }
      else {
        *errorType = SCRPT_ERROR_SEMICOLON;
      }
    }
  }
  std::__cxx11::string::~string((string *)&keyword);
  return (int)uVar3;
}

Assistant:

int LiteScript::Syntax::ReadContinue(const char *text, std::vector<Instruction> &instrl, Script::ErrorType &errorType) {
    std::string keyword;
    if (ReadName(text, keyword) == 0 || keyword != "continue")
        return 0;
    int i = 8;
    i += (int)ReadWhitespace(text + i);
    instrl.push_back(Instruction(InstrCode::INSTR_JUMP_TO, "continue"));
    if (text[i] != ';') {
        errorType = Script::ErrorType::SCRPT_ERROR_SEMICOLON;
        return i;
    }
    return i + 1;
}